

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::StreamingConcatenationExpressionSyntax
          (StreamingConcatenationExpressionSyntax *this,Token openBrace,Token operatorToken,
          ExpressionSyntax *sliceSize,Token innerOpenBrace,
          SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *expressions,
          Token innerCloseBrace,Token closeBrace)

{
  Token TVar1;
  Token TVar2;
  Token TVar3;
  bool bVar4;
  StreamExpressionSyntax *pSVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  StreamExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *__range2;
  ExpressionSyntax *sliceSize_local;
  StreamingConcatenationExpressionSyntax *this_local;
  Token operatorToken_local;
  Token openBrace_local;
  
  TVar3 = closeBrace;
  TVar2 = innerCloseBrace;
  TVar1 = innerOpenBrace;
  uVar6 = operatorToken._0_8_;
  uVar7 = openBrace._0_8_;
  PrimaryExpressionSyntax::PrimaryExpressionSyntax
            (&this->super_PrimaryExpressionSyntax,StreamingConcatenationExpression);
  (this->openBrace).kind = (short)uVar7;
  (this->openBrace).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->openBrace).info = openBrace.info;
  (this->operatorToken).kind = (short)uVar6;
  (this->operatorToken).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->operatorToken).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->operatorToken).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->operatorToken).info = operatorToken.info;
  this->sliceSize = sliceSize;
  (this->innerOpenBrace).kind = innerOpenBrace.kind;
  (this->innerOpenBrace).field_0x2 = innerOpenBrace._2_1_;
  (this->innerOpenBrace).numFlags = (NumericTokenFlags)innerOpenBrace.numFlags.raw;
  (this->innerOpenBrace).rawLen = innerOpenBrace.rawLen;
  innerOpenBrace.info = TVar1.info;
  (this->innerOpenBrace).info = innerOpenBrace.info;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::SeparatedSyntaxList
            (&this->expressions,expressions);
  (this->innerCloseBrace).kind = innerCloseBrace.kind;
  (this->innerCloseBrace).field_0x2 = innerCloseBrace._2_1_;
  (this->innerCloseBrace).numFlags = (NumericTokenFlags)innerCloseBrace.numFlags.raw;
  (this->innerCloseBrace).rawLen = innerCloseBrace.rawLen;
  innerCloseBrace.info = TVar2.info;
  (this->innerCloseBrace).info = innerCloseBrace.info;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  closeBrace.info = TVar3.info;
  (this->closeBrace).info = closeBrace.info;
  if (this->sliceSize != (ExpressionSyntax *)0x0) {
    (this->sliceSize->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::begin(&this->expressions);
  _child = SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::end(&this->expressions);
  while( true ) {
    bVar4 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_slang::syntax::StreamExpressionSyntax_**,_slang::syntax::StreamExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_slang::syntax::StreamExpressionSyntax_**,_slang::syntax::StreamExpressionSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::StreamExpressionSyntax_*> *)&child);
    if (!bVar4) break;
    pSVar5 = SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
             iterator_base<slang::syntax::StreamExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::StreamExpressionSyntax_*> *)&__end2.index);
    (pSVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_slang::syntax::StreamExpressionSyntax_**,_slang::syntax::StreamExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<slang::syntax::StreamExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::StreamExpressionSyntax_*,_unsigned_long,_slang::syntax::StreamExpressionSyntax_**,_slang::syntax::StreamExpressionSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

StreamingConcatenationExpressionSyntax(Token openBrace, Token operatorToken, ExpressionSyntax* sliceSize, Token innerOpenBrace, const SeparatedSyntaxList<StreamExpressionSyntax>& expressions, Token innerCloseBrace, Token closeBrace) :
        PrimaryExpressionSyntax(SyntaxKind::StreamingConcatenationExpression), openBrace(openBrace), operatorToken(operatorToken), sliceSize(sliceSize), innerOpenBrace(innerOpenBrace), expressions(expressions), innerCloseBrace(innerCloseBrace), closeBrace(closeBrace) {
        if (this->sliceSize) this->sliceSize->parent = this;
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
    }